

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

DataBuffer * __thiscall
sglr::ReferenceContext::getBufferBinding(ReferenceContext *this,deUint32 target)

{
  VertexArray *pVVar1;
  
  if (target == 0x8f3f) {
    return this->m_drawIndirectBufferBinding;
  }
  if (target == 0x8893) {
    pVVar1 = &this->m_clientVertexArray;
    if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
      pVVar1 = this->m_vertexArrayBinding;
    }
    return pVVar1->m_elementArrayBufferBinding;
  }
  if (target == 0x88eb) {
    return this->m_pixelPackBufferBinding;
  }
  if (target == 0x88ec) {
    return this->m_pixelUnpackBufferBinding;
  }
  if (target == 0x8a11) {
    return this->m_uniformBufferBinding;
  }
  if (target == 0x8c8e) {
    return this->m_transformFeedbackBufferBinding;
  }
  if (target == 0x8f36) {
    return this->m_copyReadBufferBinding;
  }
  if (target != 0x8f37) {
    if (target == 0x8892) {
      return this->m_arrayBufferBinding;
    }
    return (DataBuffer *)0x0;
  }
  return this->m_copyWriteBufferBinding;
}

Assistant:

DataBuffer* ReferenceContext::getBufferBinding (deUint32 target) const
{
	const VertexArray* vertexArrayObject = (m_vertexArrayBinding) ? (m_vertexArrayBinding) : (&m_clientVertexArray);

	switch (target)
	{
		case GL_ARRAY_BUFFER:				return m_arrayBufferBinding;
		case GL_COPY_READ_BUFFER:			return m_copyReadBufferBinding;
		case GL_COPY_WRITE_BUFFER:			return m_copyWriteBufferBinding;
		case GL_DRAW_INDIRECT_BUFFER:		return m_drawIndirectBufferBinding;
		case GL_ELEMENT_ARRAY_BUFFER:		return vertexArrayObject->m_elementArrayBufferBinding;
		case GL_PIXEL_PACK_BUFFER:			return m_pixelPackBufferBinding;
		case GL_PIXEL_UNPACK_BUFFER:		return m_pixelUnpackBufferBinding;
		case GL_TRANSFORM_FEEDBACK_BUFFER:	return m_transformFeedbackBufferBinding;
		case GL_UNIFORM_BUFFER:				return m_uniformBufferBinding;
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}